

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_multiview_state
          (Impl *this,Value *state,VkRenderPassMultiviewCreateInfo **out_info)

{
  bool bVar1;
  SizeType SVar2;
  VkRenderPassMultiviewCreateInfo *pVVar3;
  Type pGVar4;
  VkRenderPassMultiviewCreateInfo *info;
  VkRenderPassMultiviewCreateInfo **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkRenderPassMultiviewCreateInfo>(&this->allocator);
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"viewMasks");
  if (bVar1) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"viewMasks");
    SVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(pGVar4);
    pVVar3->subpassCount = SVar2;
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"viewMasks");
    bVar1 = parse_uints(this,pGVar4,&pVVar3->pViewMasks);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"viewOffsets");
  if (bVar1) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"viewOffsets");
    SVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(pGVar4);
    pVVar3->dependencyCount = SVar2;
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"viewOffsets");
    bVar1 = parse_sints(this,pGVar4,&pVVar3->pViewOffsets);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"correlationMasks");
  if (bVar1) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"correlationMasks");
    SVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(pGVar4);
    pVVar3->correlationMaskCount = SVar2;
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"correlationMasks");
    bVar1 = parse_uints(this,pGVar4,&pVVar3->pCorrelationMasks);
    if (!bVar1) {
      return false;
    }
  }
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_multiview_state(const Value &state, VkRenderPassMultiviewCreateInfo **out_info)
{
	auto *info = allocator.allocate_cleared<VkRenderPassMultiviewCreateInfo>();

	if (state.HasMember("viewMasks"))
	{
		info->subpassCount = state["viewMasks"].Size();
		if (!parse_uints(state["viewMasks"], &info->pViewMasks))
			return false;
	}

	if (state.HasMember("viewOffsets"))
	{
		info->dependencyCount = state["viewOffsets"].Size();
		if (!parse_sints(state["viewOffsets"], &info->pViewOffsets))
			return false;
	}

	if (state.HasMember("correlationMasks"))
	{
		info->correlationMaskCount = state["correlationMasks"].Size();
		if (!parse_uints(state["correlationMasks"], &info->pCorrelationMasks))
			return false;
	}

	*out_info = info;
	return true;
}